

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O3

void arrangeQuoters_superFast_lessThen5
               (word *pInOut,int start,int iQ,int jQ,int kQ,int lQ,int iVar,int nWords,
               char *pCanonPerm,uint *pCanonPhase)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  
  if (-1 < start) {
    bVar7 = (byte)iVar;
    iVar10 = iQ << (bVar7 & 0x1f);
    iVar8 = jQ << (bVar7 & 0x1f);
    iVar12 = kQ << (bVar7 & 0x1f);
    iVar13 = lQ << (bVar7 & 0x1f);
    iVar11 = 3 << (bVar7 & 0x1f);
    if (0x3f < iVar10) {
      __assert_fail("iQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6c,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar8) {
      __assert_fail("jQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6d,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar12) {
      __assert_fail("kQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6e,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar13) {
      __assert_fail("lQ*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x6f,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    if (0x3f < iVar11) {
      __assert_fail("3*blockSize < 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/lucky/luckyFast16.c"
                    ,0x70,
                    "void arrangeQuoters_superFast_lessThen5(word *, int, int, int, int, int, int, int, char *, unsigned int *)"
                   );
    }
    uVar1 = SFmask[iVar][iQ];
    uVar2 = SFmask[iVar][jQ];
    uVar3 = SFmask[iVar][kQ];
    uVar4 = SFmask[iVar][lQ];
    uVar9 = (ulong)(uint)start;
    do {
      uVar5 = pInOut[uVar9];
      pInOut[uVar9] =
           ((uVar5 & uVar4) << ((byte)iVar13 & 0x3f)) >> ((byte)iVar11 & 0x3f) |
           ((uVar3 & uVar5) << ((byte)iVar12 & 0x3f)) >> ((byte)(2 << (bVar7 & 0x1f)) & 0x3f) |
           ((uVar2 & uVar5) << ((byte)iVar8 & 0x3f)) >> ((byte)(1 << (bVar7 & 0x1f)) & 0x3f) |
           (uVar1 & uVar5) << ((byte)iVar10 & 0x3f);
      bVar14 = uVar9 != 0;
      uVar9 = uVar9 - 1;
    } while (bVar14);
  }
  iVar10 = iQ - jQ;
  iVar8 = -iVar10;
  if (0 < iVar10) {
    iVar8 = iVar10;
  }
  uVar6 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,(iQ + iVar8 * 4) - 4);
  *pCanonPhase = uVar6;
  return;
}

Assistant:

void arrangeQuoters_superFast_lessThen5(word* pInOut, int start, int iQ, int jQ, int kQ, int lQ, int iVar, int nWords, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i, blockSize = 1<<iVar;
//     printf("in arrangeQuoters_superFast_lessThen5\n");
//     printf("start = %d, iQ = %d,jQ = %d,kQ = %d,lQ = %d, iVar = %d, nWords = %d\n", start, iQ, jQ, kQ , lQ, iVar, nWords);
    for(i=start;i>=0;i--)
    {   
        assert( iQ*blockSize < 64 );
        assert( jQ*blockSize < 64 );
        assert( kQ*blockSize < 64 );
        assert( lQ*blockSize < 64 );
        assert( 3*blockSize < 64 );
        pInOut[i] = (pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize) |
            (((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize))>>blockSize) |
            (((pInOut[i] & SFmask[iVar][kQ])<<(kQ*blockSize))>>2*blockSize) |
            (((pInOut[i] & SFmask[iVar][lQ])<<(lQ*blockSize))>>3*blockSize);
    }
    updataInfo(iQ, jQ, iVar, pCanonPerm, pCanonPhase);
//     printf("out arrangeQuoters_superFast_lessThen5\n");

}